

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vanilla_date.cpp
# Opt level: O3

int32_t __thiscall
cornelich::cycle_formatter_yyyymmddhhmm::cycle_from_date_impl
          (cycle_formatter_yyyymmddhhmm *this,string *date)

{
  pointer pcVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  int32_t iVar5;
  long *in_FS_OFFSET;
  any_int_parser<int,10u,1u,_1> local_49;
  int h;
  int min;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  type context;
  
  h = 0;
  min = 0;
  iVar5 = -1;
  if (date->_M_string_length == 0xc) {
    bVar2 = parse_date(date,(day_point *)(*in_FS_OFFSET + -0xc));
    if (bVar2) {
      pcVar1 = (date->_M_dataplus)._M_p;
      local_40._M_current = pcVar1 + 8;
      local_38._M_current = pcVar1 + 10;
      context.attributes.car = &h;
      bVar2 = boost::spirit::qi::any_int_parser<int,10u,1u,-1>::
              parse<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::spirit::context<boost::fusion::cons<int&,boost::fusion::nil_>,boost::spirit::locals<mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,boost::spirit::unused_type,int>
                        (&local_49,&local_40,&local_38,&context,
                         (unused_type *)&boost::spirit::unused,context.attributes.car);
      if ((bVar2) && (h < 0x19)) {
        pcVar1 = (date->_M_dataplus)._M_p;
        local_40._M_current = pcVar1 + 10;
        local_38._M_current = pcVar1 + 0xc;
        context.attributes.car = &min;
        bVar2 = boost::spirit::qi::any_int_parser<int,10u,1u,-1>::
                parse<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::spirit::context<boost::fusion::cons<int&,boost::fusion::nil_>,boost::spirit::locals<mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,boost::spirit::unused_type,int>
                          (&local_49,&local_40,&local_38,&context,
                           (unused_type *)&boost::spirit::unused,context.attributes.car);
        if ((bVar2) && ((long)min < 0x3d)) {
          lVar3 = ((long)*(int *)((long)in_FS_OFFSET + -0xc) * 0x18 + (long)h) * 0x3c + (long)min;
          lVar4 = lVar3 / 0x5a0;
          iVar5 = (int32_t)(((((((long)(int)lVar4 - (long)unix_epoch) - lVar4) * 86400000000000 +
                              lVar3 * 60000000000) / 1000000000) * 1000) /
                           (long)(this->super_cycle_formatter).m_cycle_length);
        }
      }
    }
  }
  return iVar5;
}

Assistant:

std::int32_t cycle_formatter_yyyymmddhhmm::cycle_from_date_impl(const std::string & date) const
{
    thread_local day_point dp;
    int h = 0, min = 0;
    if(BOOST_UNLIKELY(date.length() != 12))
        return -1;
    if(BOOST_UNLIKELY(
                !parse_date(date, dp) ||
                !util::parse_number(date.begin() + 8, date.begin() + 10, h) || h > 24 ||
                !util::parse_number(date.begin() + 10, date.begin() + 12, min) || min > 60
                ))
        return -1;

    system_clock::time_point ts = dp + hours(h) + minutes(min);
    auto unix_timestamp = get_epoch_seconds(ts);

    return unix_timestamp * 1000 / m_cycle_length;
}